

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  Op *pOVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  Mem *pMVar10;
  void *pvVar11;
  VdbeCursor **ppVVar12;
  byte bVar13;
  long lVar14;
  long lVar15;
  Mem *pMVar16;
  Mem **ppMVar17;
  u64 uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  size_t sVar26;
  u64 uVar27;
  int *piVar28;
  sqlite3 *db;
  long lVar29;
  long lVar30;
  long lVar31;
  size_t __n;
  bool bVar32;
  int nArg;
  int local_4c;
  long local_48;
  ulong local_40;
  sqlite3 *local_38;
  
  p->pVList = pParse->pVList;
  pParse->pVList = (VList *)0x0;
  db = p->db;
  sVar2 = pParse->nVar;
  iVar3 = pParse->nTab;
  lVar14 = (long)iVar3;
  local_4c = pParse->nMaxArg;
  iVar19 = pParse->nMem + iVar3;
  lVar8 = (long)(p->nOp * 0x18);
  pOVar5 = p->aOp;
  iVar4 = pParse->szOpAlloc;
  resolveP2Values(p,&local_4c);
  if (pParse->isMultiWrite == '\0') {
    bVar13 = 0;
  }
  else {
    bVar13 = (pParse->mayAbort != '\0') << 5;
  }
  iVar19 = iVar19 + (uint)(0 < iVar19 && lVar14 == 0);
  uVar20 = iVar4 - lVar8 & 0xfffffffffffffff8;
  bVar1 = p->field_0xc6;
  p->field_0xc6 = bVar1 & 0xdf | bVar13;
  lVar22 = (long)sVar2;
  if (pParse->explain != 0) {
    if (iVar19 < 0xb) {
      iVar19 = 10;
    }
    p->field_0xc6 = bVar1 & 0xd3 | bVar13 | (pParse->explain & 3) << 2;
    bVar32 = pParse->explain == '\x02';
    uVar25 = (ulong)((uint)bVar32 * 8);
    local_48 = (long)sVar2;
    local_40 = uVar20;
    local_38 = db;
    sqlite3VdbeSetNumCols(p,(uint)!bVar32 * 4 + 4);
    piVar28 = (int *)(sqlite3VdbeMakeReady_azColName_rel + (ulong)bVar32 * 0x20);
    lVar31 = 0;
    do {
      if (p->db->mallocFailed == '\0') {
        sqlite3VdbeMemSetStr
                  ((Mem *)((long)&p->aColName->u + lVar31),
                   sqlite3VdbeMakeReady_azColName_rel + *piVar28,-1,'\x01',
                   (_func_void_void_ptr *)0x0);
      }
      uVar25 = uVar25 + 1;
      piVar28 = piVar28 + 1;
      lVar31 = lVar31 + 0x38;
      uVar20 = local_40;
      lVar22 = local_48;
      db = local_38;
    } while (uVar25 < (ulong)bVar32 * 4 + 8);
  }
  p->field_0xc6 = p->field_0xc6 & 0xfc;
  lVar9 = (long)iVar19;
  lVar24 = lVar9 * 0x38;
  pMVar10 = (Mem *)0x0;
  uVar25 = uVar20 + lVar9 * -0x38;
  pMVar16 = (Mem *)((long)pOVar5 + uVar25 + lVar8);
  lVar31 = 0;
  if (SBORROW8(uVar20,lVar24) != (long)uVar25 < 0) {
    pMVar16 = pMVar10;
    lVar31 = lVar24;
    uVar25 = uVar20;
  }
  p->aMem = pMVar16;
  lVar23 = lVar22 * 0x38;
  uVar20 = uVar25 + lVar22 * -0x38;
  pMVar16 = (Mem *)((long)pOVar5 + uVar20 + lVar8);
  lVar6 = 0;
  if (SBORROW8(uVar25,lVar23) != (long)uVar20 < 0) {
    pMVar16 = pMVar10;
    lVar6 = lVar23;
    uVar20 = uVar25;
  }
  p->aVar = pMVar16;
  lVar29 = (long)local_4c;
  lVar30 = lVar29 * 8;
  uVar25 = uVar20 + lVar29 * -8;
  lVar21 = 0;
  if ((long)uVar20 < lVar30) {
    lVar21 = lVar30;
  }
  pMVar16 = (Mem *)((long)pOVar5 + uVar25 + lVar8);
  if (SBORROW8(uVar20,lVar30) != (long)uVar25 < 0) {
    pMVar16 = pMVar10;
    uVar25 = uVar20;
  }
  p->apArg = (Mem **)pMVar16;
  __n = lVar14 * 8;
  lVar15 = uVar25 + lVar14 * -8;
  sVar26 = 0;
  if ((long)uVar25 < (long)__n) {
    sVar26 = __n;
  }
  pMVar16 = (Mem *)((long)pOVar5 + lVar15 + lVar8);
  if (SBORROW8(uVar25,__n) != lVar15 < 0) {
    pMVar16 = pMVar10;
  }
  p->apCsr = (VdbeCursor **)pMVar16;
  uVar27 = sVar26 + lVar21 + lVar6 + lVar31;
  if (uVar27 == 0) {
    if (db->mallocFailed != '\0') goto LAB_0011e199;
  }
  else {
    pvVar11 = sqlite3DbMallocRawNN(db,uVar27);
    p->pFree = pvVar11;
    if (db->mallocFailed != '\0') {
LAB_0011e199:
      p->nVar = 0;
      p->nMem = 0;
      p->nCursor = 0;
      goto LAB_0011e2a4;
    }
    pMVar16 = p->aMem;
    if (pMVar16 == (Mem *)0x0) {
      uVar18 = uVar27 + lVar9 * -0x38;
      if ((long)uVar27 < lVar24) {
        pMVar16 = (Mem *)0x0;
      }
      else {
        pMVar16 = (Mem *)((long)pvVar11 + uVar18);
        uVar27 = uVar18;
      }
    }
    p->aMem = pMVar16;
    pMVar16 = p->aVar;
    uVar18 = uVar27;
    if (pMVar16 == (Mem *)0x0) {
      uVar18 = uVar27 + lVar22 * -0x38;
      if ((long)uVar27 < lVar23) {
        pMVar16 = (Mem *)0x0;
        uVar18 = uVar27;
      }
      else {
        pMVar16 = (Mem *)((long)pvVar11 + uVar18);
      }
    }
    p->aVar = pMVar16;
    ppMVar17 = p->apArg;
    uVar27 = uVar18;
    if (ppMVar17 == (Mem **)0x0) {
      uVar27 = uVar18 + lVar29 * -8;
      if ((long)uVar18 < lVar30) {
        ppMVar17 = (Mem **)0x0;
        uVar27 = uVar18;
      }
      else {
        ppMVar17 = (Mem **)((long)pvVar11 + uVar27);
      }
    }
    p->apArg = ppMVar17;
    ppVVar12 = p->apCsr;
    if (ppVVar12 == (VdbeCursor **)0x0) {
      if ((long)uVar27 < (long)__n) {
        ppVVar12 = (VdbeCursor **)0x0;
      }
      else {
        ppVVar12 = (VdbeCursor **)((long)pvVar11 + uVar27 + lVar14 * -8);
      }
    }
    p->apCsr = ppVVar12;
  }
  p->nCursor = iVar3;
  p->nVar = sVar2;
  if (0 < sVar2) {
    uVar7 = (int)sVar2 + 1;
    piVar28 = &p->aVar->szMalloc;
    do {
      *(u16 *)(piVar28 + -3) = 1;
      *(sqlite3 **)(piVar28 + -2) = db;
      *piVar28 = 0;
      uVar7 = uVar7 - 1;
      piVar28 = piVar28 + 0xe;
    } while (1 < uVar7);
  }
  p->nMem = iVar19;
  if (0 < iVar19) {
    uVar7 = iVar19 + 1;
    piVar28 = &p->aMem->szMalloc;
    do {
      *(u16 *)(piVar28 + -3) = 0;
      *(sqlite3 **)(piVar28 + -2) = db;
      *piVar28 = 0;
      uVar7 = uVar7 - 1;
      piVar28 = piVar28 + 0xe;
    } while (1 < uVar7);
  }
  memset(p->apCsr,0,__n);
LAB_0011e2a4:
  p->eVdbeState = '\x01';
  p->rc = 0;
  p->errorAction = '\x02';
  p->minWriteFileFormat = 0xff;
  p->nChange = 0;
  p->cacheCtr = 1;
  p->pc = -1;
  p->iStatement = 0;
  p->nFkConstraint = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( pParse==p->pParse );
  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;

  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8P(sizeof(Op)*p->nOp);             /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain ){
    static const char * const azColName[] = {
       "addr", "opcode", "p1", "p2", "p3", "p4", "p5", "comment",
       "id", "parent", "notused", "detail"
    };
    int iFirst, mx, i;
    if( nMem<10 ) nMem = 10;
    p->explain = pParse->explain;
    if( pParse->explain==2 ){
      sqlite3VdbeSetNumCols(p, 4);
      iFirst = 8;
      mx = 12;
    }else{
      sqlite3VdbeSetNumCols(p, 8);
      iFirst = 0;
      mx = 8;
    }
    for(i=iFirst; i<mx; i++){
      sqlite3VdbeSetColName(p, i-iFirst, COLNAME_NAME,
                            azColName[i], SQLITE_STATIC);
    }
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  x.nNeeded = 0;
  p->aMem = allocSpace(&x, 0, nMem*sizeof(Mem));
  p->aVar = allocSpace(&x, 0, nVar*sizeof(Mem));
  p->apArg = allocSpace(&x, 0, nArg*sizeof(Mem*));
  p->apCsr = allocSpace(&x, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  p->anExec = allocSpace(&x, 0, p->nOp*sizeof(i64));
#endif
  if( x.nNeeded ){
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
    if( !db->mallocFailed ){
      p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
      p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
      p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
      p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
      p->anExec = allocSpace(&x, p->anExec, p->nOp*sizeof(i64));
#endif
    }
  }

  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    memset(p->anExec, 0, p->nOp*sizeof(i64));
#endif
  }
  sqlite3VdbeRewind(p);
}